

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_bsr_32(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = m68ki_cpu.pc;
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    uVar3 = m68ki_cpu.dar[0xf] - 4;
    m68ki_cpu.dar[0xf] = uVar3;
    my_fc_handler(m68ki_cpu.s_flag | 1);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar3 = pmmu_translate_addr(uVar3);
    }
    m68k_write_memory_32(uVar3 & m68ki_cpu.address_mask,uVar2);
    m68ki_cpu.pc = (int)(char)m68ki_cpu.ir + m68ki_cpu.pc;
  }
  else {
    my_fc_handler(m68ki_cpu.s_flag | 2);
    uVar2 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 4;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar2 = pmmu_translate_addr(uVar2);
    }
    uVar1 = m68k_read_memory_32(uVar2 & m68ki_cpu.address_mask);
    uVar2 = m68ki_cpu.pc;
    uVar3 = m68ki_cpu.dar[0xf] - 4;
    m68ki_cpu.dar[0xf] = uVar3;
    my_fc_handler(m68ki_cpu.s_flag | 1);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar3 = pmmu_translate_addr(uVar3);
    }
    m68k_write_memory_32(uVar3 & m68ki_cpu.address_mask,uVar2);
    m68ki_cpu.pc = (m68ki_cpu.pc + uVar1) - 4;
  }
  return;
}

Assistant:

static void m68k_op_bsr_32(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint offset = OPER_I_32();
		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		m68ki_push_32(REG_PC);
		REG_PC -= 4;
		m68ki_branch_32(offset);
		return;
	}
	else
	{
		m68ki_trace_t0();				   /* auto-disable (see m68kcpu.h) */
		m68ki_push_32(REG_PC);
		m68ki_branch_8(MASK_OUT_ABOVE_8(REG_IR));
	}
}